

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_export.cpp
# Opt level: O1

void __thiscall duckdb::CombineState::CombineState(CombineState *this,idx_t state_size_p)

{
  _Head_base<0UL,_unsigned_char_*,_false> __s;
  _Head_base<0UL,_unsigned_char_*,_false> __s_00;
  Allocator *allocator;
  Value local_60;
  
  (this->super_FunctionLocalState)._vptr_FunctionLocalState =
       (_func_int **)&PTR__CombineState_019b8de8;
  this->state_size = state_size_p;
  __s._M_head_impl = (uchar *)operator_new__(state_size_p);
  switchD_00570541::default(__s._M_head_impl,0,state_size_p);
  (this->state_buffer0).super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>.
  _M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = __s._M_head_impl;
  __s_00._M_head_impl = (uchar *)operator_new__(state_size_p);
  switchD_00570541::default(__s_00._M_head_impl,0,state_size_p);
  (this->state_buffer1).super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>.
  _M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = __s_00._M_head_impl;
  Value::POINTER(&local_60,(uintptr_t)__s._M_head_impl);
  Vector::Vector(&this->state_vector0,&local_60);
  Value::~Value(&local_60);
  Value::POINTER(&local_60,
                 (uintptr_t)
                 (this->state_buffer1).
                 super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
  Vector::Vector(&this->state_vector1,&local_60);
  Value::~Value(&local_60);
  allocator = Allocator::DefaultAllocator();
  ArenaAllocator::ArenaAllocator(&this->allocator,allocator,0x800);
  return;
}

Assistant:

explicit CombineState(idx_t state_size_p)
	    : state_size(state_size_p), state_buffer0(make_unsafe_uniq_array<data_t>(state_size_p)),
	      state_buffer1(make_unsafe_uniq_array<data_t>(state_size_p)),
	      state_vector0(Value::POINTER(CastPointerToValue(state_buffer0.get()))),
	      state_vector1(Value::POINTER(CastPointerToValue(state_buffer1.get()))),
	      allocator(Allocator::DefaultAllocator()) {
	}